

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O3

size_t __thiscall booster::aio::stream_socket::bytes_readable(stream_socket *this)

{
  int iVar1;
  size_t sVar2;
  system_error *this_00;
  error_code eVar3;
  error_code e;
  error_code local_28;
  
  local_28._M_value = 0;
  local_28._M_cat = (error_category *)std::_V2::system_category();
  sVar2 = bytes_readable(this,&local_28);
  iVar1 = local_28._M_value;
  if (local_28._M_value == 0) {
    return sVar2;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x40);
  eVar3._4_4_ = 0;
  eVar3._M_value = iVar1;
  eVar3._M_cat = local_28._M_cat;
  system::system_error::system_error(this_00,eVar3);
  __cxa_throw(this_00,&system::system_error::typeinfo,system::system_error::~system_error);
}

Assistant:

size_t stream_socket::bytes_readable()
{
	booster::system::error_code e;
	size_t r = bytes_readable(e);
	if(e)
		throw booster::system::system_error(e);
	return r;
}